

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

void ppu_hblank_cold_3(void)

{
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c",0x246
         );
  fwrite("Determined we should blend even though blending was off?\n\x1b[0;m",0x3e,1,_stderr);
  exit(1);
}

Assistant:

INLINE void merge_bgs(gba_ppu_t* ppu) {
    byte eva = ppu->BLDALPHA.eva >= 0b10000 ? 0b10000 : ppu->BLDALPHA.eva;
    byte evb = ppu->BLDALPHA.evb >= 0b10000 ? 0b10000 : ppu->BLDALPHA.evb;
    byte ey  = ppu->BLDY.ey      >= 0b10000 ? 0b10000 : ppu->BLDY.ey;

    bool bg_enabled[] = {
            ppu->DISPCNT.screen_display_bg0,
            ppu->DISPCNT.screen_display_bg1,
            ppu->DISPCNT.screen_display_bg2,
            ppu->DISPCNT.screen_display_bg3};

    bool bg_top[] = {
            ppu->BLDCNT.aBG0,
            ppu->BLDCNT.aBG1,
            ppu->BLDCNT.aBG2,
            ppu->BLDCNT.aBG3,
            ppu->BLDCNT.aOBJ,
            ppu->BLDCNT.aBD
    };

    bool bg_bottom[] = {
            ppu->BLDCNT.bBG0,
            ppu->BLDCNT.bBG1,
            ppu->BLDCNT.bBG2,
            ppu->BLDCNT.bBG3,
            ppu->BLDCNT.bOBJ,
            ppu->BLDCNT.bBD
    };

    for (int x = 0; x < GBA_SCREEN_X; x++) {
        gba_color_t last;
        last.raw = half_from_byte_array(ppu->pram, 0);
        int last_layer_drawn = BG_BD;
        gba_color_t draw = last;

        bool should_blend_window = true;

        // TODO really should be cacheing all this window stuff and only doing it once per pixel/scanline
        bool win0 = is_win0(ppu, x, ppu->y);
        bool win1 = is_win1(ppu, x, ppu->y);
        bool winout = !(win0 || win1);

        bool win0_display = ppu->DISPCNT.window0_display;
        bool win1_display = ppu->DISPCNT.window1_display;
        bool winobj_display = ppu->DISPCNT.obj_window_display;
        bool winout_display = win0_display || win1_display;

        if (win0 && win0_display) {
            should_blend_window = ppu->WININ.win0_color_special_effect_enable;
        } else if (win1 && win1_display) {
            should_blend_window = ppu->WININ.win1_color_special_effect_enable;
        } else if (ppu->obj_window[x] && winobj_display) {
            should_blend_window = ppu->WINOUT.obj_color_special_effect_enable;
        } else if (winout && winout_display) {
            should_blend_window = ppu->WINOUT.outside_color_special_effect_enable;
        }

        for (int i = 3; i >= 0; i--) { // Draw them in reverse priority order, so the highest priority BG is drawn last.
            int bg = background_priorities[i];
            bool should_draw = bg_enabled[bg];

            bool should_blend_single = ppu->BLDCNT.blend_mode == BLD_BLACK || ppu->BLDCNT.blend_mode == BLD_WHITE;

            bool overlaps_target_pixel = bg_bottom[last_layer_drawn]; // last layer drawn is enabled for blending as a _bottom layer_

            bool should_blend_multiple = (ppu->BLDCNT.blend_mode == BLD_STD && overlaps_target_pixel);


            // current layer is enabled for drawing, blending as a _top layer_, and eligible to be blended given above conditions.
            bool should_blend = should_blend_window && (bg_top[bg] && (should_blend_multiple || should_blend_single));
            bool should_blend_obj = ppu->obj_alpha[x] && (overlaps_target_pixel || should_blend_single);
            bool force_obj_std_blend = overlaps_target_pixel;

            gba_color_t pixel = ppu->bgbuf[bg][x];
            if (pixel.transparent) {
                // If the pixel is transparent, don't draw it, since we already defaulted to the backdrop color.
                should_draw = false;
            }
            if (should_draw && should_blend && !pixel.transparent) {
                switch (ppu->BLDCNT.blend_mode) {
                    case BLD_OFF:
                        logfatal("Determined we should blend even though blending was off?")
                    case BLD_STD: {
                        draw = blend(last, evb, pixel, eva);
                        break;
                    }
                    case BLD_WHITE: {
                        draw = blend(white, ey, pixel, 16 - ey);
                        break;
                    }
                    case BLD_BLACK: {
                        draw = blend(black, ey, pixel, 16 - ey);
                        break;
                    }
                }
                last_layer_drawn = bg;
                last = pixel;
            } else if (should_draw) {
                last = pixel;
                draw = pixel;
                last_layer_drawn = bg;
            }
            // If the OBJ pixel here has the same priority as the BG, draw it instead.
            // "Sprites cover backgrounds of the same priority"
            if (ppu->obj_priorities[x] == i && !ppu->objbuf[x].transparent) {
                pixel = ppu->objbuf[x];
                if (should_blend_obj) {
                    byte obj_blend_mode = force_obj_std_blend ? BLD_STD : ppu->BLDCNT.blend_mode;
                    switch (obj_blend_mode) {
                        case BLD_OFF:
                            logfatal("Determined we should blend even though blending was off?")
                        case BLD_STD: {
                            draw = blend(last, evb, pixel, eva);
                            break;
                        }
                        case BLD_WHITE: {
                            draw = blend(white, ey, pixel, 16 - ey);
                            break;
                        }
                        case BLD_BLACK: {
                            draw = blend(black, ey, pixel, 16 - ey);
                            break;
                        }
                    }
                } else {
                    draw = pixel;
                }
                last = pixel;
                last_layer_drawn = BG_OBJ;
            }
        }
        ppu->screen[ppu->y][x].a = 0xFF;
        ppu->screen[ppu->y][x].r = FIVEBIT_TO_EIGHTBIT_COLOR(draw.r);
        ppu->screen[ppu->y][x].g = FIVEBIT_TO_EIGHTBIT_COLOR(draw.g);
        ppu->screen[ppu->y][x].b = FIVEBIT_TO_EIGHTBIT_COLOR(draw.b);
    }
}